

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::PlainSkipTemplatedDefines<duckdb::IntervalValueConversion,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  if (plain_data->len < num_values * 0xc) {
    if (num_values != 0) {
      do {
        ByteBuffer::available(plain_data,0xc);
        plain_data->len = plain_data->len - 0xc;
        plain_data->ptr = plain_data->ptr + 0xc;
        num_values = num_values - 1;
      } while (num_values != 0);
    }
  }
  else if (num_values != 0) {
    plain_data->len = plain_data->len + num_values * -0xc;
    plain_data->ptr = plain_data->ptr + num_values * 0xc;
  }
  return;
}

Assistant:

void PlainSkipTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values);
		} else {
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values);
		}
	}